

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int PrepareLine(void)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  CStringsList *this;
  _Elt_pointer pSVar4;
  
  ListSilentOrExternalEmits();
  CompiledCurrentLine = CompiledCurrentLine + 1;
  if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pSVar4 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pSVar4 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 8;
    }
    if (pSVar4[-1].IsInWork == false) {
      lp = line;
      this = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this,line,(CStringsList *)0x0);
      (pSVar4[-1].Pointer)->next = this;
      pSVar4[-1].Pointer = this;
      iVar2 = islabchar(*lp);
      if (iVar2 != 0) {
        if ((Options::syx == '\x01') && (iVar2 = ParseDirective_REPT(), iVar2 != 0)) {
          return 1;
        }
        while (iVar2 = islabchar(*lp), iVar2 != 0) {
          lp = lp + 1;
        }
        if (*lp == ':') {
          lp = lp + 1;
        }
      }
      ParseDirective_REPT();
      return 1;
    }
  }
  lp = ReplaceDefine(line);
  if (DeviceID != (char *)0x0) {
    CDevice::CheckPage(Device,CHECK_NO_EMIT);
  }
  ListAddress = CurAddress;
  pbVar3 = (byte *)lp;
  if (ConvertEncoding == 0) {
    for (; bVar1 = *pbVar3, bVar1 != 0; pbVar3 = pbVar3 + 1) {
      if ((char)bVar1 < '\0') {
        *pbVar3 = win2dos[bVar1 & 0x7f];
      }
    }
  }
  return 0;
}

Assistant:

int PrepareLine() {
	ListSilentOrExternalEmits();

	++CompiledCurrentLine;
	if (!RepeatStack.empty()) {
		SRepeatStack& dup = RepeatStack.top();
		if (!dup.IsInWork) {
			lp = line;
			dup.Pointer->next = new CStringsList(lp);
			dup.Pointer = dup.Pointer->next;
#ifdef DEBUG_COUT_PARSE_LINE
			fprintf(stderr, ">%d %d %c%ld-%d [%s]\n", pass, CurSourcePos.line,
					(!RepeatStack.empty() && RepeatStack.top().IsInWork ? '!' : '.'),RepeatStack.size(),
					(!RepeatStack.empty() ? RepeatStack.top().Level : 0), line);
#endif
			// check if there's some label at beginning of the line, skip it
			if (islabchar(*lp)) {
				// if directives are enabled at beginning of line, check if it is nested DUP/REPT/WHILE/EDUP...
				if (Options::syx.IsPseudoOpBOF && ParseDirective_REPT()) return 1;
				// skip label chars and trailing colon
				while (islabchar(*lp)) ++lp;
				if (':' == *lp) ++lp;
			}
			// catch any nested DUP/WHILE/REPT and EDUP directives
			ParseDirective_REPT();
			return 1;
		}
	}
#ifdef DEBUG_COUT_PARSE_LINE
	fprintf(stderr, "|%d %d %c%ld-%d [%s]\n", pass, CurSourcePos.line,
			(!RepeatStack.empty() && RepeatStack.top().IsInWork ? '!' : '.'), RepeatStack.size(),
			(!RepeatStack.empty() ? RepeatStack.top().Level : 0), line);
#endif
	lp = ReplaceDefine(line);

#ifdef DEBUG_COUT_PARSE_LINE
	fprintf(stderr,"rdOut [%s]->[%s] %d\n", line, lp, comlin);
#endif

	// update current address by memory wrapping, current page, etc... (before the label is defined)
	if (DeviceID)	Device->CheckPage(CDevice::CHECK_NO_EMIT);
	ListAddress = CurAddress;

	if (!ConvertEncoding) {
		byte* lp2 = (byte*) lp;
		while (*lp2) {
			if (128 <= *lp2) {
				*lp2 = win2dos[(*lp2) - 128];
			}
			++lp2;
		}
	}
	return 0;
}